

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O3

int N_VInvTest_Serial(N_Vector x,N_Vector z)

{
  double dVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  
  lVar5 = (long)*x->content;
  if (0 < lVar5) {
    lVar2 = *(long *)((long)x->content + 8);
    lVar3 = *(long *)((long)z->content + 8);
    iVar7 = 1;
    lVar6 = 0;
    do {
      dVar1 = *(double *)(lVar2 + lVar6 * 8);
      if ((dVar1 != 0.0) || (iVar4 = 0, NAN(dVar1))) {
        *(double *)(lVar3 + lVar6 * 8) = 1.0 / dVar1;
        iVar4 = iVar7;
      }
      iVar7 = iVar4;
      lVar6 = lVar6 + 1;
    } while (lVar5 != lVar6);
    return iVar7;
  }
  return 1;
}

Assistant:

booleantype N_VInvTest_Serial(N_Vector x, N_Vector z)
{
  sunindextype i, N;
  realtype *xd, *zd;
  booleantype no_zero_found;

  xd = zd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  zd = NV_DATA_S(z);

  no_zero_found = SUNTRUE;
  for (i = 0; i < N; i++) {
    if (xd[i] == ZERO)
      no_zero_found = SUNFALSE;
    else
      zd[i] = ONE/xd[i];
  }

  return no_zero_found;
}